

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_raster_example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  SW_FT_Pos *pSVar1;
  uint32_t y_00;
  bool bVar2;
  uint32_t x_00;
  element_type *peVar3;
  Color local_170;
  int local_16c;
  uint32_t local_168;
  int32_t i;
  int32_t y;
  int32_t x;
  SW_FT_Span_ *span;
  iterator __end1;
  iterator __begin1;
  vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> *__range1;
  SW_FT_Raster_Params params;
  SpanHolder holder;
  FTOutline outline;
  Color local_34;
  undefined4 local_30;
  int local_2c;
  undefined1 local_28 [8];
  shared_ptr<TRM::Bitmap> framebuffer;
  char **argv_local;
  int argc_local;
  
  local_2c = 800;
  local_30 = 600;
  framebuffer.super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::make_shared<TRM::Bitmap,int,int>((int *)local_28,&local_2c);
  peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  TRM::Color::Color(&local_34,0xff,0xff,0xff,0xff);
  TRM::Bitmap::ClearWithColor(peVar3,&local_34);
  FTOutline::FTOutline
            ((FTOutline *)
             &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  FTOutline::move_to((FTOutline *)
                     &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,10.0,10.0);
  FTOutline::quad_to((FTOutline *)
                     &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,160.0,10.0,160.0,160.0);
  FTOutline::line_to((FTOutline *)
                     &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,10.0,10.0);
  FTOutline::end((FTOutline *)
                 &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
  pSVar1 = &params.clip_box.yMax;
  SpanHolder::SpanHolder((SpanHolder *)pSVar1);
  params.source._0_4_ = 3;
  params._8_8_ = ft_raster_generation_cb;
  params.gray_spans = ft_bbox_cb;
  __range1 = (vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> *)
             &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  params.bbox_cb = (SW_FT_BboxFunc)pSVar1;
  gray_raster_render((gray_PRaster)0x0,(SW_FT_Raster_Params *)&__range1);
  pSVar1 = &params.clip_box.yMax;
  __end1 = std::vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>::begin
                     ((vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> *)pSVar1);
  span = (SW_FT_Span_ *)
         std::vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>::end
                   ((vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_> *)pSVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SW_FT_Span__*,_std::vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>_>
                                *)&span);
    if (!bVar2) break;
    _y = __gnu_cxx::
         __normal_iterator<SW_FT_Span__*,_std::vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>_>::
         operator*(&__end1);
    i = (int32_t)_y->x;
    local_168 = (uint32_t)_y->y;
    for (local_16c = 0; local_16c < (int)(uint)_y->len; local_16c = local_16c + 1) {
      peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      y_00 = local_168;
      x_00 = i + local_16c;
      TRM::Color::Color(&local_170,'\0','\0','\0',_y->coverage);
      TRM::Bitmap::BlendPixel(peVar3,x_00,y_00,&local_170);
    }
    __gnu_cxx::
    __normal_iterator<SW_FT_Span__*,_std::vector<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>_>::
    operator++(&__end1);
  }
  peVar3 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  TRM::Bitmap::WriteToPng(peVar3,"ft_raster_test.png");
  SpanHolder::~SpanHolder((SpanHolder *)&params.clip_box.yMax);
  FTOutline::~FTOutline
            ((FTOutline *)
             &holder.spans.super__Vector_base<SW_FT_Span_,_std::allocator<SW_FT_Span_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<TRM::Bitmap>::~shared_ptr((shared_ptr<TRM::Bitmap> *)local_28);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
  std::shared_ptr<TRM::Bitmap> framebuffer =
      std::make_shared<TRM::Bitmap>(WIDTH, HEIGHT);

  framebuffer->ClearWithColor(TRM::Color(255, 255, 255, 255));

  FTOutline outline;

  outline.move_to(10, 10);
  outline.quad_to(160, 10, 160, 160);
  outline.line_to(10, 10);

  outline.end();

  SpanHolder holder;

  SW_FT_Raster_Params params;
  params.flags = SW_FT_RASTER_FLAG_DIRECT | SW_FT_RASTER_FLAG_AA;
  params.gray_spans = &ft_raster_generation_cb;
  params.bbox_cb = &ft_bbox_cb;
  params.user = &holder;
  params.source = &outline.ft;

  sw_ft_grays_raster.raster_render(nullptr, &params);

  for (auto const& span : holder.spans) {
    int32_t x = span.x;
    int32_t y = span.y;
    for (int32_t i = 0; i < span.len; i++) {
      framebuffer->BlendPixel(x + i, y, TRM::Color(0, 0, 0, span.coverage));
    }
  }

  framebuffer->WriteToPng("ft_raster_test.png");
  return 0;
}